

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.c
# Opt level: O1

void DC16_C(uint8_t *dst)

{
  uint8_t *puVar1;
  uint uVar2;
  byte *pbVar3;
  long lVar4;
  undefined1 uVar5;
  undefined4 uVar6;
  undefined1 auVar7 [16];
  
  pbVar3 = dst + -1;
  uVar2 = 0x10;
  lVar4 = -0x10;
  do {
    uVar2 = (uint)dst[lVar4 + -0x10] + *pbVar3 + uVar2;
    pbVar3 = pbVar3 + 0x20;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0);
  lVar4 = 0;
  uVar5 = (undefined1)(uVar2 >> 5);
  auVar7 = ZEXT216(CONCAT11(uVar5,uVar5));
  auVar7 = pshuflw(auVar7,auVar7,0);
  uVar6 = auVar7._0_4_;
  do {
    puVar1 = dst + lVar4;
    *(undefined4 *)puVar1 = uVar6;
    *(undefined4 *)(puVar1 + 4) = uVar6;
    *(undefined4 *)(puVar1 + 8) = uVar6;
    *(undefined4 *)(puVar1 + 0xc) = uVar6;
    lVar4 = lVar4 + 0x20;
  } while (lVar4 != 0x200);
  return;
}

Assistant:

static void DC16_C(uint8_t* dst) {    // DC
  int DC = 16;
  int j;
  for (j = 0; j < 16; ++j) {
    DC += dst[-1 + j * BPS] + dst[j - BPS];
  }
  Put16(DC >> 5, dst);
}